

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_nvector.c
# Opt level: O3

void N_VPrintFile(N_Vector v,FILE *outfile)

{
  _func_void_N_Vector_FILE_ptr *UNRECOVERED_JUMPTABLE;
  size_t __size;
  char *__ptr;
  
  if (outfile == (FILE *)0x0) {
    return;
  }
  if (v == (N_Vector)0x0) {
    __ptr = "NULL Vector\n";
    __size = 0xc;
  }
  else {
    UNRECOVERED_JUMPTABLE = v->ops->nvprintfile;
    if (UNRECOVERED_JUMPTABLE != (_func_void_N_Vector_FILE_ptr *)0x0) {
      (*UNRECOVERED_JUMPTABLE)(v,outfile);
      return;
    }
    __ptr = "NULL PrintFile Op\n";
    __size = 0x12;
  }
  fwrite(__ptr,__size,1,(FILE *)outfile);
  return;
}

Assistant:

void N_VPrintFile(N_Vector v, FILE* outfile)
{
  if (outfile != NULL) {
    if (v == NULL) {
      fprintf(outfile, "NULL Vector\n");
    } else if (v->ops->nvprintfile == NULL) {
      fprintf(outfile, "NULL PrintFile Op\n");
    } else {
      v->ops->nvprintfile(v, outfile);
    }
  }
}